

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::addFollowing
          (BreakCache *this,int32_t position,int32_t ruleStatusIdx,UpdatePositionValues update)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t nextIdx;
  UpdatePositionValues update_local;
  int32_t ruleStatusIdx_local;
  int32_t position_local;
  BreakCache *this_local;
  
  iVar1 = modChunkSize(this->fEndBufIdx + 1);
  if (iVar1 == this->fStartBufIdx) {
    iVar2 = modChunkSize(this->fStartBufIdx + 6);
    this->fStartBufIdx = iVar2;
  }
  this->fBoundaries[iVar1] = position;
  this->fStatuses[iVar1] = (uint16_t)ruleStatusIdx;
  this->fEndBufIdx = iVar1;
  if (update == UpdateCachePosition) {
    this->fBufIdx = iVar1;
    this->fTextIdx = position;
  }
  return;
}

Assistant:

void RuleBasedBreakIterator::BreakCache::addFollowing(int32_t position, int32_t ruleStatusIdx, UpdatePositionValues update) {
    U_ASSERT(position > fBoundaries[fEndBufIdx]);
    U_ASSERT(ruleStatusIdx <= UINT16_MAX);
    int32_t nextIdx = modChunkSize(fEndBufIdx + 1);
    if (nextIdx == fStartBufIdx) {
        fStartBufIdx = modChunkSize(fStartBufIdx + 6);    // TODO: experiment. Probably revert to 1.
    }
    fBoundaries[nextIdx] = position;
    fStatuses[nextIdx] = static_cast<uint16_t>(ruleStatusIdx);
    fEndBufIdx = nextIdx;
    if (update == UpdateCachePosition) {
        // Set current position to the newly added boundary.
        fBufIdx = nextIdx;
        fTextIdx = position;
    } else {
        // Retaining the original cache position.
        // Check if the added boundary wraps around the buffer, and would over-write the original position.
        // It's the responsibility of callers of this function to not add too many.
        U_ASSERT(nextIdx != fBufIdx);
    }
}